

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::AtomicBaseline<(std::memory_order)3>::GetName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_1a;
  undefined1 local_19;
  void *local_18;
  AtomicBaseline<(std::memory_order)3> *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (AtomicBaseline<(std::memory_order)3> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Atomic Baseline (",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  anon_unknown.dwarf_e77e::GetMemoryOrderRepr(memory_order_release);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]
  std::string GetName() const noexcept override {
    std::string name = "Atomic Baseline (";
    name.append(GetMemoryOrderRepr(Order));
    name.append(")");
    return name;
  }